

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhash_kv_open(unqlite_kv_engine *pEngine,pgno dbSize)

{
  unqlite_kv_io *puVar1;
  uint *puVar2;
  uchar *zRaw;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  char cVar8;
  unqlite_page *pHeader;
  unqlite_kv_engine local_40;
  unqlite_page *local_38;
  
  puVar1 = pEngine->pIo;
  if (dbSize == 0) {
    iVar3 = (*puVar1->xNew)(puVar1->pHandle,(unqlite_page **)&local_40);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = (*pEngine->pIo->xWrite)((unqlite_page *)local_40.pIo);
    if (iVar3 != 0) {
      return iVar3;
    }
    puVar2 = (uint *)(local_40.pIo)->pHandle;
    pEngine[0x1a].pIo = local_40.pIo;
    uVar4 = *(uint *)&pEngine[0x27].pIo;
    *puVar2 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar7 = (*(code *)pEngine[0x18].pIo)("chm@symisc",10);
    *(ushort *)((long)puVar2 + 6) = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
    *(char *)((long)puVar2 + 5) = (char)((uint)uVar7 >> 0x10);
    *(char *)(puVar2 + 1) = (char)((uint)uVar7 >> 0x18);
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar1 = pEngine[0x24].pIo;
    *(ulong *)(puVar2 + 4) =
         (ulong)puVar1 >> 0x38 | ((ulong)puVar1 & 0xff000000000000) >> 0x28 |
         ((ulong)puVar1 & 0xff0000000000) >> 0x18 | ((ulong)puVar1 & 0xff00000000) >> 8 |
         ((ulong)puVar1 & 0xff000000) << 8 | ((ulong)puVar1 & 0xff0000) << 0x18 |
         ((ulong)puVar1 & 0xff00) << 0x28 | (long)puVar1 << 0x38;
    puVar1 = pEngine[0x25].pIo;
    *(ulong *)(puVar2 + 6) =
         (ulong)puVar1 >> 0x38 | ((ulong)puVar1 & 0xff000000000000) >> 0x28 |
         ((ulong)puVar1 & 0xff0000000000) >> 0x18 | ((ulong)puVar1 & 0xff00000000) >> 8 |
         ((ulong)puVar1 & 0xff000000) << 8 | ((ulong)puVar1 & 0xff0000) << 0x18 |
         ((ulong)puVar1 & 0xff00) << 0x28 | (long)puVar1 << 0x38;
    pEngine[0x1f].pIo = (unqlite_kv_io *)(local_40.pIo)->xGet;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[10] = 0;
    *(short *)&pEngine[0x20].pIo =
         ((short)puVar2 - (short)*(undefined4 *)&(local_40.pIo)->pHandle) + 0x2c;
  }
  else {
    iVar3 = (*puVar1->xGet)(puVar1->pHandle,1,(unqlite_page **)&local_40);
    if (iVar3 != 0) {
      return iVar3;
    }
    puVar2 = (uint *)(local_40.pIo)->pHandle;
    pEngine[0x1a].pIo = local_40.pIo;
    uVar4 = *puVar2;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    *(uint *)&pEngine[0x27].pIo = uVar4;
    iVar3 = -0x18;
    if (uVar4 == 0xfa782dcb) {
      uVar4 = puVar2[1];
      uVar5 = (*(code *)pEngine[0x18].pIo)("chm@symisc",10);
      if (uVar5 == (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
         ) {
        SyBigEndianUnpack64((uchar *)(puVar2 + 2),(sxu64 *)(pEngine + 0x23));
        SyBigEndianUnpack64((uchar *)(puVar2 + 4),(sxu64 *)(pEngine + 0x24));
        SyBigEndianUnpack64((uchar *)(puVar2 + 6),(sxu64 *)(pEngine + 0x25));
        pEngine[0x26].pIo = (unqlite_kv_io *)((long)pEngine[0x25].pIo * 2);
        pEngine[0x1f].pIo = (unqlite_kv_io *)(local_40.pIo)->xGet;
        SyBigEndianUnpack64((uchar *)(puVar2 + 8),(sxu64 *)(pEngine + 0x21));
        uVar4 = puVar2[10];
        *(uint *)((long)&pEngine[0x20].pIo + 4) =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        zRaw = (uchar *)(local_40.pIo)->pHandle;
        *(short *)&pEngine[0x20].pIo = ((short)puVar2 - (short)zRaw) + 0x2c;
        iVar3 = lhMapLoadPage((lhash_kv_engine *)pEngine,(lhash_bmap_page *)(pEngine + 0x1f),zRaw);
        if (iVar3 == 0) {
          do {
            puVar1 = pEngine[0x21].pIo;
            if (puVar1 == (unqlite_kv_io *)0x0) {
              cVar8 = '\x02';
            }
            else {
              iVar6 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pgno)puVar1,&local_38);
              if (iVar6 == 0) {
                pEngine[0x1f].pIo = puVar1;
                *(undefined2 *)&pEngine[0x20].pIo = 0;
                iVar6 = lhMapLoadPage((lhash_kv_engine *)pEngine,(lhash_bmap_page *)(pEngine + 0x1f)
                                      ,local_38->zData);
                cVar8 = iVar6 != 0;
                if ((bool)cVar8) {
                  iVar3 = iVar6;
                }
              }
              else {
                cVar8 = '\x01';
                iVar3 = iVar6;
              }
            }
          } while (cVar8 == '\0');
          if (cVar8 == '\x02') {
            iVar3 = 0;
          }
        }
      }
      else {
        (*pEngine->pIo->xErr)(pEngine->pIo->pHandle,"Invalid hash function");
        iVar3 = -9;
      }
    }
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  return 0;
}

Assistant:

static int lhash_kv_open(unqlite_kv_engine *pEngine,pgno dbSize)
{
	lhash_kv_engine *pHash = (lhash_kv_engine *)pEngine;
	unqlite_page *pHeader;
	int rc;
	if( dbSize < 1 ){
		/* A new database, create the header */
		rc = pEngine->pIo->xNew(pEngine->pIo->pHandle,&pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Acquire a writer lock */
		rc = pEngine->pIo->xWrite(pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Write the hash header */
		rc = lhash_write_header(pHash,pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}else{
		/* Acquire the page one of the database */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Read the database header */
		rc = lhash_read_header(pHash,pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	return UNQLITE_OK;
}